

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.h
# Opt level: O2

Element * __thiscall Regex::Element::getLastChild(Element *this)

{
  Element *pEVar1;
  Element *pEVar2;
  
  pEVar2 = this->mChild;
  if (pEVar2 != (Element *)0x0) {
    do {
      pEVar1 = pEVar2;
      pEVar2 = pEVar2->mNext;
    } while (pEVar2 != (Element *)0x0);
    return pEVar1;
  }
  return (Element *)0x0;
}

Assistant:

Element *getLastChild()
		{
			if ( mChild != NULL )
			{
				Element *c = mChild;
				while( c->mNext != NULL )
					c = c->mNext;
	
				return c;
			}

			return NULL;
		}